

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk.c
# Opt level: O3

void test_write_disk(void)

{
  int iVar1;
  mode_t mVar2;
  archive_entry *paVar3;
  archive *paVar4;
  ssize_t sVar5;
  char *pcVar6;
  void *buff;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  stat_conflict st;
  stat local_c0;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                  ,L'ø',L'\x12');
  paVar3 = archive_entry_new();
  lVar7 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'û',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"file");
  archive_entry_set_mode(paVar3,0x81ed);
  paVar4 = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'F',(uint)(paVar4 != (archive *)0x0),"(ad = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  archive_write_disk_set_options(paVar4,L'\x04');
  failure("%s","Test creating a regular file");
  archive_entry_set_size(paVar3,0x1b);
  archive_entry_set_mtime(paVar3,0x75bcd15,0);
  iVar1 = archive_write_header(paVar4,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'\\',0,"0",(long)iVar1,"archive_write_header(ad, ae)",paVar4);
  sVar5 = archive_write_data(paVar4,"abcdefghijklmnopqrstuvwxyz",0x1b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L']',0x1b,"sizeof(data)",sVar5,"archive_write_data(ad, data, sizeof(data))",
                      (void *)0x0);
  iVar1 = archive_write_finish_entry(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'^',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'_',0,"0",(long)iVar1,"archive_write_free(ad)",(void *)0x0);
  pcVar6 = archive_entry_pathname(paVar3);
  mVar2 = archive_entry_mode(paVar3);
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'b',pcVar6,mVar2 & 0x1ff);
  pcVar6 = archive_entry_pathname(paVar3);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'c',pcVar6,0x1b);
  pcVar6 = archive_entry_pathname(paVar3);
  assertion_file_mtime
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
             ,L'e',pcVar6,0x75bcd15,0);
  failure("No atime given, so atime should get set to current time");
  pcVar6 = archive_entry_pathname(paVar3);
  assertion_file_atime_recent
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
             ,L'g',pcVar6);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'Ă',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"file2");
  archive_entry_set_mode(paVar3,0x81ed);
  buff = malloc(100000);
  cVar10 = '\0';
  cVar11 = '\x01';
  cVar12 = '\x02';
  cVar13 = '\x03';
  cVar14 = '\x04';
  cVar15 = '\x05';
  cVar16 = '\x06';
  cVar17 = '\a';
  cVar18 = '\b';
  cVar19 = '\t';
  cVar20 = '\n';
  cVar21 = '\v';
  cVar22 = '\f';
  cVar23 = '\r';
  cVar24 = '\x0e';
  cVar25 = '\x0f';
  do {
    pcVar6 = (char *)((long)buff + lVar7);
    *pcVar6 = cVar10;
    pcVar6[1] = cVar11;
    pcVar6[2] = cVar12;
    pcVar6[3] = cVar13;
    pcVar6[4] = cVar14;
    pcVar6[5] = cVar15;
    pcVar6[6] = cVar16;
    pcVar6[7] = cVar17;
    pcVar6[8] = cVar18;
    pcVar6[9] = cVar19;
    pcVar6[10] = cVar20;
    pcVar6[0xb] = cVar21;
    pcVar6[0xc] = cVar22;
    pcVar6[0xd] = cVar23;
    pcVar6[0xe] = cVar24;
    pcVar6[0xf] = cVar25;
    lVar7 = lVar7 + 0x10;
    cVar10 = cVar10 + '\x10';
    cVar11 = cVar11 + '\x10';
    cVar12 = cVar12 + '\x10';
    cVar13 = cVar13 + '\x10';
    cVar14 = cVar14 + '\x10';
    cVar15 = cVar15 + '\x10';
    cVar16 = cVar16 + '\x10';
    cVar17 = cVar17 + '\x10';
    cVar18 = cVar18 + '\x10';
    cVar19 = cVar19 + '\x10';
    cVar20 = cVar20 + '\x10';
    cVar21 = cVar21 + '\x10';
    cVar22 = cVar22 + '\x10';
    cVar23 = cVar23 + '\x10';
    cVar24 = cVar24 + '\x10';
    cVar25 = cVar25 + '\x10';
  } while (lVar7 != 100000);
  paVar4 = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'v',(uint)(paVar4 != (archive *)0x0),"(ad = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  failure("%s","Test creating another regular file");
  archive_entry_set_size(paVar3,100000);
  iVar1 = archive_write_header(paVar4,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'}',0,"0",(long)iVar1,"archive_write_header(ad, ae)",paVar4);
  uVar8 = 0;
  do {
    sVar5 = archive_write_data_block(paVar4,(void *)((long)buff + uVar8),1000,uVar8);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                        ,L'\x80',0,"ARCHIVE_OK",sVar5,
                        "archive_write_data_block(ad, data + i, 1000, i)",paVar4);
    bVar9 = uVar8 < 0x17ed1;
    uVar8 = uVar8 + 1000;
  } while (bVar9);
  iVar1 = archive_write_finish_entry(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'\x82',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'\x83',0,"0",(long)iVar1,"archive_write_free(ad)",(void *)0x0);
  pcVar6 = archive_entry_pathname(paVar3);
  mVar2 = archive_entry_mode(paVar3);
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'\x86',pcVar6,mVar2 & 0x1ff);
  pcVar6 = archive_entry_pathname(paVar3);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'\x87',pcVar6,100000);
  pcVar6 = archive_entry_pathname(paVar3);
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
             ,L'\x88',buff,L'𘚠',pcVar6);
  free(buff);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'ĉ',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"file3");
  archive_entry_set_mode(paVar3,0x81ed);
  paVar4 = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'\x93',(uint)(paVar4 != (archive *)0x0),
                   "(ad = archive_write_disk_new()) != NULL",(void *)0x0);
  failure("%s","Regular file with size restriction");
  archive_entry_set_size(paVar3,5);
  iVar1 = archive_write_header(paVar4,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'\x97',0,"0",(long)iVar1,"archive_write_header(ad, ae)",paVar4);
  sVar5 = archive_write_data(paVar4,"abcdefghijklmnopqrstuvwxyz",0x1b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'\x98',5,"5",sVar5,"archive_write_data(ad, data, sizeof(data))",(void *)0x0)
  ;
  iVar1 = archive_write_finish_entry(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'\x99',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'\x9a',0,"0",(long)iVar1,"archive_write_free(ad)",(void *)0x0);
  pcVar6 = archive_entry_pathname(paVar3);
  iVar1 = stat(pcVar6,&local_c0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'\x9d',(uint)(iVar1 == 0),"0 == stat(archive_entry_pathname(ae), &st)",
                   (void *)0x0);
  uVar8 = (ulong)local_c0.st_mode;
  mVar2 = archive_entry_mode(paVar3);
  failure("st.st_mode=%o archive_entry_mode(ae)=%o",uVar8,(ulong)mVar2);
  mVar2 = archive_entry_mode(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'¡',uVar8,"st.st_mode",(ulong)(mVar2 & 0xffffffed),
                      "(archive_entry_mode(ae) & ~UMASK)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'£',local_c0.st_size,"st.st_size",5,"5",(void *)0x0);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'Đ',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"file3");
  archive_entry_set_mode(paVar3,0x81ed);
  paVar4 = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'®',(uint)(paVar4 != (archive *)0x0),"(ad = archive_write_disk_new()) != NULL"
                   ,(void *)0x0);
  iVar1 = archive_write_header(paVar4,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'°',0,"0",(long)iVar1,"archive_write_header(ad, ae)",paVar4);
  sVar5 = archive_write_data_block(paVar4,"abcdefghijklmnopqrstuvwxyz",0x1b,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'²',0,"ARCHIVE_OK",sVar5,
                      "archive_write_data_block(ad, data, sizeof(data), 0)",(void *)0x0);
  iVar1 = archive_write_finish_entry(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'³',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'´',0,"0",(long)iVar1,"archive_write_free(ad)",(void *)0x0);
  pcVar6 = archive_entry_pathname(paVar3);
  iVar1 = stat(pcVar6,&local_c0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'·',(uint)(iVar1 == 0),"0 == stat(archive_entry_pathname(ae), &st)",
                   (void *)0x0);
  mVar2 = archive_entry_mode(paVar3);
  failure("st.st_mode=%o archive_entry_mode(ae)=%o",(ulong)local_c0.st_mode,(ulong)mVar2);
  mVar2 = archive_entry_mode(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'»',(ulong)local_c0.st_mode,"st.st_mode",(ulong)(mVar2 & 0xffffffed),
                      "(archive_entry_mode(ae) & ~UMASK)",(void *)0x0);
  failure("Regular file with unspecified size");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'¾',local_c0.st_size,"st.st_size",0x1b,"sizeof(data)",(void *)0x0);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'ė',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"file");
  archive_entry_set_mode(paVar3,0x81d4);
  create(paVar3,"Test creating a file over an existing file.");
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'Ğ',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"dir");
  archive_entry_set_mode(paVar3,0x416d);
  create(paVar3,"Test creating a regular dir.");
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'ĥ',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"file");
  archive_entry_set_mode(paVar3,0x41e2);
  create(paVar3,"Test creating a dir over an existing file.");
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'Ĭ',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"file");
  archive_entry_set_mode(paVar3,0x81e4);
  create(paVar3,"Test creating a file over an existing dir.");
  archive_entry_free(paVar3);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk)
{
	struct archive_entry *ae;
#if defined(_WIN32) && !defined(__CYGWIN__)
	wchar_t *fullpath;
	DWORD l;
#endif

	/* Force the umask to something predictable. */
	assertUmask(UMASK);

	/* A regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file(ae, "Test creating a regular file");
	archive_entry_free(ae);

	/* Another regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file2(ae, "Test creating another regular file");
	archive_entry_free(ae);

	/* A regular file with a size restriction */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file3");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file3(ae, "Regular file with size restriction");
	archive_entry_free(ae);

	/* A regular file with an unspecified size */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file3");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file4(ae, "Regular file with unspecified size");
	archive_entry_free(ae);

	/* A regular file over an existing file */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0724);
	create(ae, "Test creating a file over an existing file.");
	archive_entry_free(ae);

	/* A directory. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir");
	archive_entry_set_mode(ae, S_IFDIR | 0555);
	create(ae, "Test creating a regular dir.");
	archive_entry_free(ae);

	/* A directory over an existing file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFDIR | 0742);
	create(ae, "Test creating a dir over an existing file.");
	archive_entry_free(ae);

	/* A file over an existing dir. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0744);
	create(ae, "Test creating a file over an existing dir.");
	archive_entry_free(ae);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* A file with unusable characters in its file name. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname_w(ae, L"f:i*l?e\"f<i>l|e");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file_win(ae, "Test creating a regular file"
	    " with unusable characters in its file name");
	archive_entry_free(ae);

	/* A file with unusable characters in its directory name. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname_w(ae, L"d:i*r?e\"c<t>o|ry/file1");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file_win(ae, "Test creating a regular file"
	    " with unusable characters in its file name");
	archive_entry_free(ae);

	/* A full-path file with unusable characters in its file name. */
	assert((l = GetCurrentDirectoryW(0, NULL)) != 0);
	assert((fullpath = malloc((l + 20) * sizeof(wchar_t))) != NULL);
	assert((l = GetCurrentDirectoryW(l, fullpath)) != 0);
	wcscat(fullpath, L"\\f:i*l?e\"f<i>l|e");
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname_w(ae, fullpath);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file_win(ae, "Test creating a regular file"
	    " with unusable characters in its file name");
	archive_entry_free(ae);
	free(fullpath);

	/* A full-path file with unusable characters in its directory name. */
	assert((l = GetCurrentDirectoryW(0, NULL)) != 0);
	assert((fullpath = malloc((l + 30) * sizeof(wchar_t))) != NULL);
	assert((l = GetCurrentDirectoryW(l, fullpath)) != 0);
	wcscat(fullpath, L"\\d:i*r?e\"c<t>o|ry/file1");
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname_w(ae, fullpath);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	create_reg_file_win(ae, "Test creating a regular file"
	    " with unusable characters in its file name");
	archive_entry_free(ae);
	free(fullpath);
#endif /* _WIN32 && !__CYGWIN__ */
}